

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KLV.h
# Opt level: O2

void __thiscall
ASDCP::MXF::InterchangeObject::InterchangeObject(InterchangeObject *this,Dictionary *d)

{
  UUID *pUVar1;
  UL *pUVar2;
  
  (this->super_KLVPacket).m_KeyStart = (byte_t *)0x0;
  (this->super_KLVPacket).m_KLLength = 0;
  (this->super_KLVPacket).m_UL.super_Identifier<16U>.m_HasValue = false;
  (this->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[0] = '\0';
  (this->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[1] = '\0';
  (this->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[2] = '\0';
  (this->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[3] = '\0';
  (this->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[4] = '\0';
  (this->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[5] = '\0';
  (this->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[6] = '\0';
  pUVar2 = &(this->super_KLVPacket).m_UL;
  (pUVar2->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->super_KLVPacket).m_ValueStart = (byte_t *)0x0;
  (this->super_KLVPacket).m_ValueLength = 0;
  (this->super_KLVPacket).m_UL.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_002112c8;
  (this->super_KLVPacket)._vptr_KLVPacket = (_func_int **)&PTR__InterchangeObject_002164a0;
  this->m_Dict = d;
  this->m_Lookup = (IPrimerLookup *)0x0;
  (this->InstanceUID).super_Identifier<16U>.m_HasValue = false;
  (this->InstanceUID).super_Identifier<16U>.m_Value[0] = '\0';
  (this->InstanceUID).super_Identifier<16U>.m_Value[1] = '\0';
  (this->InstanceUID).super_Identifier<16U>.m_Value[2] = '\0';
  (this->InstanceUID).super_Identifier<16U>.m_Value[3] = '\0';
  (this->InstanceUID).super_Identifier<16U>.m_Value[4] = '\0';
  (this->InstanceUID).super_Identifier<16U>.m_Value[5] = '\0';
  (this->InstanceUID).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar1 = &this->InstanceUID;
  (pUVar1->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->InstanceUID).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->InstanceUID).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00216010;
  (this->GenerationUID).m_property.super_Identifier<16U>.m_HasValue = false;
  (this->GenerationUID).m_property.super_Identifier<16U>.m_Value[0] = '\0';
  (this->GenerationUID).m_property.super_Identifier<16U>.m_Value[1] = '\0';
  (this->GenerationUID).m_property.super_Identifier<16U>.m_Value[2] = '\0';
  (this->GenerationUID).m_property.super_Identifier<16U>.m_Value[3] = '\0';
  (this->GenerationUID).m_property.super_Identifier<16U>.m_Value[4] = '\0';
  (this->GenerationUID).m_property.super_Identifier<16U>.m_Value[5] = '\0';
  (this->GenerationUID).m_property.super_Identifier<16U>.m_Value[6] = '\0';
  pUVar1 = &(this->GenerationUID).m_property;
  (pUVar1->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->GenerationUID).m_property.super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->GenerationUID).m_property.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00216010;
  (this->GenerationUID).m_has_value = false;
  return;
}

Assistant:

KLVPacket() : m_KeyStart(0), m_KLLength(0), m_ValueStart(0), m_ValueLength(0) {}